

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneIndex::QGraphicsSceneIndex(QGraphicsSceneIndex *this,QGraphicsScene *scene)

{
  QGraphicsSceneIndexPrivate *this_00;
  
  this_00 = (QGraphicsSceneIndexPrivate *)operator_new(0x80);
  QGraphicsSceneIndexPrivate::QGraphicsSceneIndexPrivate(this_00,scene);
  QObject::QObject((QObject *)this,(QObjectPrivate *)this_00,&scene->super_QObject);
  *(undefined ***)this = &PTR_metaObject_007edfa8;
  QGraphicsSceneIndexPrivate::init
            (*(QGraphicsSceneIndexPrivate **)(this + 8),(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QGraphicsSceneIndex::QGraphicsSceneIndex(QGraphicsScene *scene)
: QObject(*new QGraphicsSceneIndexPrivate(scene), scene)
{
    d_func()->init();
}